

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Read_From_File_And_Create_Bill
          (Hospital *this,vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,fstream *inFile
          )

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  ostream *this_00;
  istream *piVar4;
  reference this_01;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *this_02;
  string local_210 [8];
  string word;
  istringstream local_1f0 [8];
  istringstream ss;
  int local_60;
  int local_5c;
  int Patients_Index;
  int counter;
  string items;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  fstream *inFile_local;
  vector<Patient,_std::allocator<Patient>_> *All_Of_Patients_local;
  Hospital *this_local;
  
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)inFile;
  uVar3 = std::ios::fail();
  if ((uVar3 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_38);
    std::__cxx11::string::string((string *)&Patients_Index);
    local_5c = 0;
    local_60 = 0;
    while( true ) {
      bVar1 = std::ios::eof();
      if (((bVar1 ^ 0xff) & 1) == 0) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)
                 temp.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&Patients_Index);
      std::__cxx11::istringstream::istringstream(local_1f0,(string *)&Patients_Index,_S_in);
      std::__cxx11::string::string(local_210);
      while( true ) {
        piVar4 = std::operator>>((istream *)local_1f0,local_210);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
        if (!bVar2) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38,(value_type *)local_210);
        if (local_5c == 4) {
          this_01 = std::vector<Patient,_std::allocator<Patient>_>::operator[]
                              (All_Of_Patients,(long)local_60);
          this_02 = Patient::Bill_Info_getter_abi_cxx11_(this_01);
          std::
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::push_back(this_02,(value_type *)local_38);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_38);
          local_5c = -1;
        }
        local_5c = local_5c + 1;
      }
      local_60 = local_60 + 1;
      std::__cxx11::string::~string(local_210);
      std::__cxx11::istringstream::~istringstream(local_1f0);
    }
    std::__cxx11::string::~string((string *)&Patients_Index);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
    return;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"Error opening file !!! ");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void Hospital::Read_From_File_And_Create_Bill (vector<Patient>&All_Of_Patients  , fstream& inFile ){

    if (inFile.fail()){
        cerr << "Error opening file !!! " <<endl;
        exit(1) ;
    }

    vector<string>temp;
    string items;
    int counter=0;
    int Patients_Index=0;

    while(!inFile.eof()) {

        getline(inFile, items);
        istringstream ss(items);
        string word;

        while (ss >> word)
        {
            temp.push_back(word);
            if(counter == 4){
                All_Of_Patients[Patients_Index].Bill_Info_getter().push_back(temp);
                temp.clear();
                counter = -1;
            }
            counter++;
        }
        Patients_Index++;
    }

}